

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::Draw::anon_unknown_0::DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndirectParams>::
iterate(TestStatus *__return_storage_ptr__,
       DrawTestInstance<vkt::Draw::(anonymous_namespace)::DrawIndirectParams> *this)

{
  VkBool32 VVar1;
  Context *this_00;
  TestLog *log;
  DeviceInterface *pDVar2;
  Image *this_01;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  bool bVar3;
  VkResult VVar4;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *pAVar5;
  VkQueue queue;
  VkPhysicalDeviceFeatures *pVVar6;
  pointer pVVar7;
  char *__s;
  pointer pVVar8;
  long lVar9;
  ulong uVar10;
  const_iterator vertex;
  pointer __x;
  uint uVar11;
  VkSemaphore *__n;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> indirectAlloc;
  ConstPixelBufferAccess renderedFrame;
  Move<vk::Handle<(vk::HandleType)8>_> indirectBuffer;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertices;
  TextureLevel refImage;
  deUint32 queueFamilyIndex;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colors;
  VkBuffer vertexBuffer;
  VkDeviceSize vertexBufferOffset;
  VkSubmitInfo submitInfo;
  
  this_00 = (this->super_DrawTestInstanceBase).super_TestInstance.m_context;
  log = this_00->m_testCtx->m_log;
  vk = Context::getDeviceInterface(this_00);
  device = Context::getDevice((this->super_DrawTestInstanceBase).super_TestInstance.m_context);
  pAVar5 = Context::getDefaultAllocator
                     ((this->super_DrawTestInstanceBase).super_TestInstance.m_context);
  queue = Context::getUniversalQueue
                    ((this->super_DrawTestInstanceBase).super_TestInstance.m_context);
  queueFamilyIndex =
       Context::getUniversalQueueFamilyIndex
                 ((this->super_DrawTestInstanceBase).super_TestInstance.m_context);
  pVVar6 = Context::getDeviceFeatures
                     ((this->super_DrawTestInstanceBase).super_TestInstance.m_context);
  VVar1 = pVVar6->multiDrawIndirect;
  DrawTestInstanceBase::beginRenderPass(&this->super_DrawTestInstanceBase);
  pDVar2 = (this->super_DrawTestInstanceBase).m_vk;
  (*pDVar2->_vptr_DeviceInterface[0x58])
            (pDVar2,(this->super_DrawTestInstanceBase).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,1);
  pDVar2 = (this->super_DrawTestInstanceBase).m_vk;
  (*pDVar2->_vptr_DeviceInterface[0x4c])
            (pDVar2,(this->super_DrawTestInstanceBase).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,
             (this->super_DrawTestInstanceBase).m_pipeline.
             super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  indirectBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  indirectBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  indirectBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  indirectBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  indirectAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
       (Allocation *)0x0;
  __n = (VkSemaphore *)
        ((long)(this->m_data).commands.
               super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->m_data).commands.
              super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>
              ._M_impl.super__Vector_impl_data._M_start);
  submitInfo.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  submitInfo.pNext = (void *)0x0;
  submitInfo._16_8_ = (ulong)(uint)submitInfo._20_4_ << 0x20;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x100;
  submitInfo.commandBufferCount = 1;
  submitInfo.pWaitSemaphores = __n;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)&queueFamilyIndex;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&renderedFrame,vk,device,
                     (VkBufferCreateInfo *)&submitInfo,(VkAllocationCallbacks *)0x0);
  refImage.m_size.m_data[2] = renderedFrame.m_size.m_data[2];
  refImage._20_4_ = renderedFrame.m_pitch.m_data[0];
  refImage.m_data.m_ptr = (void *)renderedFrame.m_pitch.m_data._4_8_;
  refImage.m_format = renderedFrame.m_format;
  refImage.m_size.m_data[0] = renderedFrame.m_size.m_data[0];
  refImage.m_size.m_data[1] = renderedFrame.m_size.m_data[1];
  renderedFrame.m_format.order = R;
  renderedFrame.m_format.type = SNORM_INT8;
  renderedFrame.m_size.m_data[0] = 0;
  renderedFrame.m_size.m_data[1] = 0;
  renderedFrame.m_size.m_data[2] = 0;
  renderedFrame.m_pitch.m_data[0] = 0;
  renderedFrame.m_pitch.m_data[1] = 0;
  renderedFrame.m_pitch.m_data[2] = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::reset
            (&indirectBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  indirectBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)refImage._16_8_;
  indirectBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)refImage.m_data.m_ptr;
  indirectBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal._0_4_ =
       refImage.m_format.order;
  indirectBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal._4_4_ =
       refImage.m_format.type;
  indirectBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)refImage.m_size.m_data._0_8_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)8>_> *)&renderedFrame);
  ::vk::getBufferMemoryRequirements
            ((VkMemoryRequirements *)&refImage,vk,device,
             (VkBuffer)
             indirectBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
  (*pAVar5->_vptr_Allocator[3])(&renderedFrame,pAVar5,&refImage,1);
  renderedFrame.m_format.order = R;
  renderedFrame.m_format.type = SNORM_INT8;
  data._8_8_ = indirectAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
               m_data._8_8_;
  data.ptr = indirectAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
             m_data.ptr;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
            (&indirectAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>,
             data);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&renderedFrame);
  VVar4 = (*vk->_vptr_DeviceInterface[0xc])
                    (vk,device,
                     indirectBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                     m_internal,
                     ((indirectAlloc.
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                      ptr)->m_memory).m_internal,
                     (indirectAlloc.
                      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                     ptr)->m_offset);
  ::vk::checkResult(VVar4,
                    "vk.bindBufferMemory(vkDevice, *indirectBuffer, indirectAlloc->getMemory(), indirectAlloc->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktBasicDrawTests.cpp"
                    ,0x388);
  memcpy((indirectAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
         .ptr)->m_hostPtr,
         (this->m_data).commands.
         super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>.
         _M_impl.super__Vector_impl_data._M_start,(size_t)__n);
  ::vk::flushMappedMemoryRange
            ((this->super_DrawTestInstanceBase).m_vk,device,
             (VkDeviceMemory)
             ((indirectAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
               m_data.ptr)->m_memory).m_internal,
             (indirectAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
              m_data.ptr)->m_offset,(VkDeviceSize)__n);
  pVVar8 = (this->m_data).commands.
           super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pVVar7 = (this->m_data).commands.
           super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar10 = (long)pVVar7 - (long)pVVar8 >> 4;
  if ((uVar10 < 2) || (VVar1 != 0)) {
    pDVar2 = (this->super_DrawTestInstanceBase).m_vk;
    (*pDVar2->_vptr_DeviceInterface[0x5b])
              (pDVar2,(this->super_DrawTestInstanceBase).m_cmdBuffer.
                      super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
               indirectBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
               ,(indirectAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                 .m_data.ptr)->m_offset,uVar10,0x10);
  }
  else {
    for (uVar11 = 0; (ulong)uVar11 < (ulong)((long)pVVar7 - (long)pVVar8 >> 4); uVar11 = uVar11 + 1)
    {
      pDVar2 = (this->super_DrawTestInstanceBase).m_vk;
      (*pDVar2->_vptr_DeviceInterface[0x5b])
                (pDVar2,(this->super_DrawTestInstanceBase).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
                 indirectBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                 m_internal,
                 (ulong)(uVar11 * 0x10 +
                        (int)(indirectAlloc.
                              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                              m_data.ptr)->m_offset),1,0x10);
      pVVar8 = (this->m_data).commands.
               super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pVVar7 = (this->m_data).commands.
               super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  pDVar2 = (this->super_DrawTestInstanceBase).m_vk;
  (*pDVar2->_vptr_DeviceInterface[0x76])
            (pDVar2,(this->super_DrawTestInstanceBase).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  pDVar2 = (this->super_DrawTestInstanceBase).m_vk;
  (*pDVar2->_vptr_DeviceInterface[0x4a])
            (pDVar2,(this->super_DrawTestInstanceBase).m_cmdBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  submitInfo.pCommandBuffers = (VkCommandBuffer *)&(this->super_DrawTestInstanceBase).m_cmdBuffer;
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo._44_4_ = 0;
  pDVar2 = (this->super_DrawTestInstanceBase).m_vk;
  VVar4 = (*pDVar2->_vptr_DeviceInterface[2])(pDVar2,queue,1,&submitInfo,0);
  ::vk::checkResult(VVar4,"m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktBasicDrawTests.cpp"
                    ,0x3ac);
  renderedFrame.m_format =
       ::vk::mapVkFormat((this->super_DrawTestInstanceBase).m_colorAttachmentFormat);
  tcu::TextureLevel::TextureLevel(&refImage,&renderedFrame.m_format,0x100,0x100,1);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&renderedFrame,&refImage);
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x3f80000000000000;
  tcu::clear((PixelBufferAccess *)&renderedFrame,(Vec4 *)&vertices);
  for (pVVar8 = (this->m_data).commands.
                super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pVVar8 != (this->m_data).commands.
                super__Vector_base<vk::VkDrawIndirectCommand,_std::allocator<vk::VkDrawIndirectCommand>_>
                ._M_impl.super__Vector_impl_data._M_finish; pVVar8 = pVVar8 + 1) {
    vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    colors.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    colors.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    colors.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    __x = (this->m_data).super_DrawParamsBase.vertices.
          super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
          ._M_impl.super__Vector_impl_data._M_start + pVVar8->firstVertex;
    for (lVar9 = (ulong)pVVar8->vertexCount << 5; lVar9 != 0; lVar9 = lVar9 + -0x20) {
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                 &vertices.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                 ,&__x->position);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                 &colors.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                 ,&__x->color);
      __x = __x + 1;
    }
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&renderedFrame,&refImage);
    DrawTestInstanceBase::generateRefImage
              (&this->super_DrawTestInstanceBase,(PixelBufferAccess *)&renderedFrame,
               (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               &vertices.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>,
               (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               &colors.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
    std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
              (&colors.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
    std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
              (&vertices.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  }
  pDVar2 = (this->super_DrawTestInstanceBase).m_vk;
  VVar4 = (*pDVar2->_vptr_DeviceInterface[3])(pDVar2,queue);
  ::vk::checkResult(VVar4,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktBasicDrawTests.cpp"
                    ,0x3c2);
  this_01 = (this->super_DrawTestInstanceBase).m_colorTargetImage.m_ptr;
  pAVar5 = Context::getDefaultAllocator
                     ((this->super_DrawTestInstanceBase).super_TestInstance.m_context);
  Image::readSurface(&renderedFrame,this_01,queue,pAVar5,VK_IMAGE_LAYOUT_GENERAL,
                     (VkOffset3D)(ZEXT412(0) << 0x40),0x100,0x100,VK_IMAGE_ASPECT_COLOR_BIT,0,0);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&vertices,&refImage);
  bVar3 = imageCompare(log,(ConstPixelBufferAccess *)&vertices,&renderedFrame,
                       (this->m_data).super_DrawParamsBase.topology);
  __s = qpGetTestResultName((uint)!bVar3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vertices,__s,(allocator<char> *)&colors);
  __return_storage_ptr__->m_code = (uint)!bVar3;
  std::__cxx11::string::string((string *)&__return_storage_ptr__->m_description,(string *)&vertices)
  ;
  std::__cxx11::string::~string((string *)&vertices);
  tcu::TextureLevel::~TextureLevel(&refImage);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            (&indirectAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            (&indirectBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus DrawTestInstance<DrawIndirectParams>::iterate (void)
{
	tcu::TestLog						&log				= m_context.getTestContext().getLog();
	const vk::DeviceInterface&			vk					= m_context.getDeviceInterface();
	const vk::VkDevice					vkDevice			= m_context.getDevice();
	vk::Allocator&						allocator			= m_context.getDefaultAllocator();
	const vk::VkQueue					queue				= m_context.getUniversalQueue();
	const deUint32						queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	const vk::VkPhysicalDeviceFeatures	features			= m_context.getDeviceFeatures();

	beginRenderPass();

	const vk::VkDeviceSize	vertexBufferOffset	= 0;
	const vk::VkBuffer		vertexBuffer		= m_vertexBuffer->object();

	m_vk.cmdBindVertexBuffers(*m_cmdBuffer, 0, 1, &vertexBuffer, &vertexBufferOffset);
	m_vk.cmdBindPipeline(*m_cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);

	vk::Move<vk::VkBuffer>		indirectBuffer;
	de::MovePtr<vk::Allocation>	indirectAlloc;

	{
		const vk::VkDeviceSize	indirectInfoSize	= m_data.commands.size() * sizeof(vk::VkDrawIndirectCommand);

		const vk::VkBufferCreateInfo	indirectCreateInfo =
		{
			vk::VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,	// VkStructureType		sType;
			DE_NULL,									// const void*			pNext;
			0u,											// VkBufferCreateFlags	flags;
			indirectInfoSize,							// VkDeviceSize			size;
			vk::VK_BUFFER_USAGE_INDIRECT_BUFFER_BIT,	// VkBufferUsageFlags	usage;
			vk::VK_SHARING_MODE_EXCLUSIVE,				// VkSharingMode		sharingMode;
			1u,											// deUint32				queueFamilyIndexCount;
			&queueFamilyIndex,							// const deUint32*		pQueueFamilyIndices;
		};

		indirectBuffer	= createBuffer(vk, vkDevice, &indirectCreateInfo);
		indirectAlloc	= allocator.allocate(getBufferMemoryRequirements(vk, vkDevice, *indirectBuffer), vk::MemoryRequirement::HostVisible);
		VK_CHECK(vk.bindBufferMemory(vkDevice, *indirectBuffer, indirectAlloc->getMemory(), indirectAlloc->getOffset()));

		deMemcpy(indirectAlloc->getHostPtr(), &(m_data.commands[0]), (size_t)indirectInfoSize);

		vk::flushMappedMemoryRange(m_vk, vkDevice, indirectAlloc->getMemory(), indirectAlloc->getOffset(), indirectInfoSize);
	}

	// If multiDrawIndirect not supported execute single calls
	if (m_data.commands.size() > 1 && !(features.multiDrawIndirect))
	{
		for (deUint32 cmdIdx = 0; cmdIdx < m_data.commands.size(); ++cmdIdx)
		{
			const deUint32	offset	= (deUint32)(indirectAlloc->getOffset() + cmdIdx * sizeof(vk::VkDrawIndirectCommand));
			m_vk.cmdDrawIndirect(*m_cmdBuffer, *indirectBuffer, offset, 1, sizeof(vk::VkDrawIndirectCommand));
		}
	}
	else
	{
		m_vk.cmdDrawIndirect(*m_cmdBuffer, *indirectBuffer, indirectAlloc->getOffset(), (deUint32)m_data.commands.size(), sizeof(vk::VkDrawIndirectCommand));
	}

	m_vk.cmdEndRenderPass(*m_cmdBuffer);
	m_vk.endCommandBuffer(*m_cmdBuffer);

	vk::VkSubmitInfo	submitInfo =
	{
		vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,			// VkStructureType			sType;
		DE_NULL,									// const void*				pNext;
		0,											// deUint32					waitSemaphoreCount;
		DE_NULL,									// const VkSemaphore*		pWaitSemaphores;
		(const vk::VkPipelineStageFlags*)DE_NULL,
		1,											// deUint32					commandBufferCount;
		&m_cmdBuffer.get(),							// const VkCommandBuffer*	pCommandBuffers;
		0,											// deUint32					signalSemaphoreCount;
		DE_NULL										// const VkSemaphore*		pSignalSemaphores;
	};
	VK_CHECK(m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL));

	// Validation
	tcu::TextureLevel refImage (vk::mapVkFormat(m_colorAttachmentFormat), (int)(0.5 + WIDTH), (int)(0.5 + HEIGHT));
	tcu::clear(refImage.getAccess(), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

	for (std::vector<vk::VkDrawIndirectCommand>::const_iterator it = m_data.commands.begin(); it != m_data.commands.end(); ++it)
	{
		std::vector<tcu::Vec4>	vertices;
		std::vector<tcu::Vec4>	colors;

		std::vector<PositionColorVertex>::const_iterator	firstIt	= m_data.vertices.begin() + it->firstVertex;
		std::vector<PositionColorVertex>::const_iterator	lastIt	= firstIt + it->vertexCount;

		for (std::vector<PositionColorVertex>::const_iterator vertex = firstIt; vertex != lastIt; ++vertex)
		{
			vertices.push_back(vertex->position);
			colors.push_back(vertex->color);
		}
		generateRefImage(refImage.getAccess(), vertices, colors);
	}

	VK_CHECK(m_vk.queueWaitIdle(queue));

	const vk::VkOffset3D zeroOffset = { 0, 0, 0 };
	const tcu::ConstPixelBufferAccess renderedFrame = m_colorTargetImage->readSurface(queue, m_context.getDefaultAllocator(),
		vk::VK_IMAGE_LAYOUT_GENERAL, zeroOffset, WIDTH, HEIGHT, vk::VK_IMAGE_ASPECT_COLOR_BIT);

	qpTestResult res = QP_TEST_RESULT_PASS;

	if (!imageCompare(log, refImage.getAccess(), renderedFrame, m_data.topology))
		res = QP_TEST_RESULT_FAIL;

	return tcu::TestStatus(res, qpGetTestResultName(res));
}